

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall
QtPrivate::BindingStatusOrList::removeObject(BindingStatusOrList *this,QObject *object)

{
  __normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_> __last;
  iterator this_00;
  const_iterator in_RSI;
  __normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_> in_RDI;
  long in_FS_OFFSET;
  List *objectList;
  __normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_> it;
  __normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_>
  *in_stack_ffffffffffffff98;
  vector<QObject_*,_std::allocator<QObject_*>_> *in_stack_ffffffffffffffa0;
  BindingStatusOrList *in_stack_ffffffffffffffa8;
  const_iterator __first;
  
  __first._M_current = *(QObject ***)(in_FS_OFFSET + 0x28);
  __last._M_current = (QObject **)list(in_stack_ffffffffffffffa8);
  if ((List *)__last._M_current != (List *)0x0) {
    std::vector<QObject_*,_std::allocator<QObject_*>_>::begin(in_stack_ffffffffffffffa0);
    std::vector<QObject_*,_std::allocator<QObject_*>_>::end(in_stack_ffffffffffffffa0);
    std::
    remove<__gnu_cxx::__normal_iterator<QObject**,std::vector<QObject*,std::allocator<QObject*>>>,QObject*>
              (in_RDI,__last,(QObject **)in_stack_ffffffffffffffa0);
    __gnu_cxx::__normal_iterator<QObject*const*,std::vector<QObject*,std::allocator<QObject*>>>::
    __normal_iterator<QObject**>
              ((__normal_iterator<QObject_*const_*,_std::vector<QObject_*,_std::allocator<QObject_*>_>_>
                *)__last._M_current,in_stack_ffffffffffffff98);
    this_00 = std::vector<QObject_*,_std::allocator<QObject_*>_>::end(__last._M_current);
    __gnu_cxx::__normal_iterator<QObject*const*,std::vector<QObject*,std::allocator<QObject*>>>::
    __normal_iterator<QObject**>
              ((__normal_iterator<QObject_*const_*,_std::vector<QObject_*,_std::allocator<QObject_*>_>_>
                *)__last._M_current,in_stack_ffffffffffffff98);
    std::vector<QObject_*,_std::allocator<QObject_*>_>::erase
              ((vector<QObject_*,_std::allocator<QObject_*>_> *)this_00._M_current,__first,in_RSI);
  }
  if (*(QObject ***)(in_FS_OFFSET + 0x28) != __first._M_current) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QtPrivate::BindingStatusOrList::removeObject(QObject *object)
{
    List *objectList = list();
    if (!objectList)
        return;
    auto it = std::remove(objectList->begin(), objectList->end(), object);
    objectList->erase(it, objectList->end());
}